

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFABaseState<char,_Centaurus::IndexVector>::add_transition
          (NFABaseState<char,_Centaurus::IndexVector> *this,CharClass<char> *cc,int dest,
          bool long_flag)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  CharClass<char> *this_01;
  NFATransition<char> *tr;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range3
  ;
  bool long_flag_local;
  CharClass<char> *pCStack_18;
  int dest_local;
  CharClass<char> *cc_local;
  NFABaseState<char,_Centaurus::IndexVector> *this_local;
  
  __range3._3_1_ = long_flag;
  __range3._4_4_ = dest;
  pCStack_18 = cc;
  cc_local = (CharClass<char> *)this;
  bVar1 = CharClass<char>::is_epsilon(cc);
  if (!bVar1) {
    __end0 = std::
             vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ::begin(&this->m_transitions);
    tr = (NFATransition<char> *)
         std::
         vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
         end(&this->m_transitions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                       *)&tr), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                ::operator*(&__end0);
      iVar2 = NFATransition<char>::dest(this_00);
      if (iVar2 == __range3._4_4_) {
        this_01 = NFATransition<char>::label(this_00);
        bVar1 = CharClass<char>::is_epsilon(this_01);
        if (!bVar1) {
          NFATransition<char>::add_class(this_00,pCStack_18);
          if ((__range3._3_1_ & 1) == 0) {
            return;
          }
          NFATransition<char>::set_long(this_00,true);
          return;
        }
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
      ::operator++(&__end0);
    }
  }
  std::vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>::
  emplace_back<Centaurus::CharClass<char>const&,int&,bool&>
            ((vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>
              *)&this->m_transitions,pCStack_18,(int *)((long)&__range3 + 4),
             (bool *)((long)&__range3 + 3));
  return;
}

Assistant:

void add_transition(const CharClass<TCHAR>& cc, int dest, bool long_flag = false)
    {
        if (!cc.is_epsilon())
        {
            for (auto& tr : m_transitions)
            {
                if (tr.dest() == dest && !tr.label().is_epsilon())
                {
                    tr.add_class(cc);
                    if (long_flag) tr.set_long();
                    return;
                }
            }
        }
        m_transitions.emplace_back(cc, dest, long_flag);
    }